

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O0

ScopedFILE FDToFILE(ScopedFD *fd,char *mode)

{
  bool bVar1;
  int __fd;
  FILE *__p;
  char *in_RDX;
  char *mode_local;
  ScopedFD *fd_local;
  ScopedFILE *ret;
  
  std::unique_ptr<_IO_FILE,FileCloser>::unique_ptr<FileCloser,void>
            ((unique_ptr<_IO_FILE,FileCloser> *)fd);
  __fd = ScopedFD::get((ScopedFD *)mode);
  __p = fdopen(__fd,in_RDX);
  std::unique_ptr<_IO_FILE,_FileCloser>::reset((unique_ptr<_IO_FILE,_FileCloser> *)fd,(pointer)__p);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)fd);
  if (bVar1) {
    ScopedFD::release((ScopedFD *)mode);
  }
  return (__uniq_ptr_data<_IO_FILE,_FileCloser,_true,_true>)
         (__uniq_ptr_data<_IO_FILE,_FileCloser,_true,_true>)fd;
}

Assistant:

ScopedFILE FDToFILE(ScopedFD fd, const char *mode) {
  ScopedFILE ret;
#if defined(OPENSSL_WINDOWS)
  ret.reset(_fdopen(fd.get(), mode));
#else
  ret.reset(fdopen(fd.get(), mode));
#endif
  // |fdopen| takes ownership of |fd| on success.
  if (ret) {
    fd.release();
  }
  return ret;
}